

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathWrapExternal(void *val)

{
  xmlXPathObjectPtr ret;
  void *val_local;
  
  val_local = (*xmlMalloc)(0x48);
  if ((undefined4 *)val_local == (undefined4 *)0x0) {
    val_local = (void *)0x0;
  }
  else {
    memset(val_local,0,0x48);
    *(undefined4 *)val_local = 8;
    *(void **)((long)val_local + 0x28) = val;
  }
  return (xmlXPathObjectPtr)val_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPathWrapExternal (void *val) {
    xmlXPathObjectPtr ret;

    ret = (xmlXPathObjectPtr) xmlMalloc(sizeof(xmlXPathObject));
    if (ret == NULL)
	return(NULL);
    memset(ret, 0 , sizeof(xmlXPathObject));
    ret->type = XPATH_USERS;
    ret->user = val;
    return(ret);
}